

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint data,Static_Data_Model *M)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint init_base;
  uint x;
  Static_Data_Model *M_local;
  uint data_local;
  Arithmetic_Codec *this_local;
  
  uVar1 = this->base;
  if (data == M->last_symbol) {
    iVar3 = M->distribution[data] * (this->length >> 0xf);
    this->base = iVar3 + this->base;
    this->length = this->length - iVar3;
  }
  else {
    uVar2 = M->distribution[data];
    uVar4 = this->length >> 0xf;
    this->length = uVar4;
    iVar3 = uVar2 * uVar4;
    this->base = iVar3 + this->base;
    this->length = M->distribution[data + 1] * this->length - iVar3;
  }
  if (this->base < uVar1) {
    propagate_carry(this);
  }
  if (this->length < 0x1000000) {
    renorm_enc_interval(this);
  }
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned data,
                                  Static_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
      if (data >= M.data_symbols) AC_Error("invalid data symbol");
    #endif

      unsigned x, init_base = base;
                                                               // compute products
      if (data == M.last_symbol) {
        x = M.distribution[data] * (length >> DM__LengthShift);
        base   += x;                                            // update interval
        length -= x;                                          // no product needed
      }
      else {
        x = M.distribution[data] * (length >>= DM__LengthShift);
        base   += x;                                            // update interval
        length  = M.distribution[data+1] * length - x;
      }
             
      if (init_base > base) propagate_carry();                 // overflow = carry

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization
    }